

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twosided_exponential_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::twosided_exponential_dist<long_double>::cdf
          (twosided_exponential_dist<long_double> *this,result_type_conflict3 x)

{
  result_type_conflict3 *extraout_RAX;
  result_type_conflict3 *extraout_RAX_00;
  result_type_conflict3 *prVar1;
  param_type *in_RSI;
  result_type_conflict3 *in_RDI;
  double __x;
  double __x_00;
  longdouble in_stack_00000008;
  
  if ((longdouble)0 < in_stack_00000008) {
    param_type::mu(in_RDI,in_RSI);
    std::exp(__x_00);
    prVar1 = extraout_RAX_00;
  }
  else {
    param_type::mu(in_RDI,in_RSI);
    std::exp(__x);
    prVar1 = extraout_RAX;
  }
  return prVar1;
}

Assistant:

cdf(result_type x) const {
      return x <= 0 ? math::exp(x / P.mu()) / 2 : 1 - math::exp(-x / P.mu()) / 2;
    }